

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void cfd::CoinSelection::ConvertToUtxo
               (Txid *txid,uint32_t vout,string *output_descriptor,Amount *amount,string *asset,
               void *binary_data,Utxo *utxo,Script *scriptsig_template)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *in_RCX;
  string *in_RDX;
  undefined4 in_ESI;
  Txid *in_RDI;
  string *in_R8;
  undefined8 in_R9;
  UtxoData *in_stack_00000008;
  Script *in_stack_00000010;
  UtxoData utxo_data;
  UtxoData *in_stack_000006c0;
  Utxo *in_stack_000006c8;
  UtxoData *in_stack_000006d0;
  string *in_stack_fffffffffffffa50;
  CfdException *this;
  ConfidentialAssetId local_598;
  UtxoData *in_stack_fffffffffffffaa0;
  Txid local_548;
  undefined4 local_528;
  string local_338 [32];
  undefined8 local_318;
  undefined1 local_310;
  undefined4 local_308;
  undefined8 local_300;
  ConfidentialAssetId local_2f8 [14];
  Script local_b8;
  undefined1 local_7d;
  undefined1 local_69 [33];
  CfdSourceLocation local_48;
  undefined8 local_30;
  string *local_28;
  undefined8 *local_20;
  string *local_18;
  undefined4 local_c;
  Txid *local_8;
  
  if (in_stack_00000008 == (UtxoData *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_utxo.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x3aa;
    local_48.funcname = "ConvertToUtxo";
    core::logger::warn<>(&local_48,"utxo is nullptr.");
    local_7d = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"Failed to convert utxo. utxo is nullptr.",(allocator *)this
              );
    core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffa50);
    local_7d = 0;
    __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  (in_stack_00000008->address).type_ = kCfdSuccess;
  (in_stack_00000008->address).addr_type_ = 0;
  *(undefined8 *)&(in_stack_00000008->address).witness_ver_ = 0;
  (in_stack_00000008->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_stack_00000008->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_stack_00000008->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000008->redeem_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_stack_00000008->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000008->redeem_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000008->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_stack_00000008->redeem_script)._vptr_Script = (_func_int **)0x0;
  (in_stack_00000008->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_stack_00000008->locking_script).script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_stack_00000008->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000008->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000008->locking_script)._vptr_Script = (_func_int **)0x0;
  (in_stack_00000008->locking_script).script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000008->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&in_stack_00000008->vout = 0;
  (in_stack_00000008->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000008->txid).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_stack_00000008->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_stack_00000008->txid)._vptr_Txid = (_func_int **)0x0;
  (in_stack_00000008->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_stack_00000008->block_hash).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_stack_00000008->block_height = 0;
  (in_stack_00000008->block_hash)._vptr_BlockHash = (_func_int **)0x0;
  *(undefined8 *)&(in_stack_00000008->address).address_ = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  UtxoData::UtxoData(in_stack_fffffffffffffaa0);
  core::Txid::operator=(&local_548,local_8);
  local_528 = local_c;
  std::__cxx11::string::operator=(local_338,local_18);
  local_318 = *local_20;
  local_310 = *(undefined1 *)(local_20 + 1);
  local_308 = 4;
  if (in_stack_00000010 != (Script *)0x0) {
    core::Script::operator=(&local_b8,in_stack_00000010);
  }
  local_300 = local_30;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    core::ConfidentialAssetId::ConfidentialAssetId(&local_598,local_28);
    core::ConfidentialAssetId::operator=(local_2f8,&local_598);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x531b30);
  }
  UtxoUtil::ConvertToUtxo(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0);
  UtxoData::~UtxoData(in_stack_00000008);
  return;
}

Assistant:

void CoinSelection::ConvertToUtxo(
    const Txid& txid, uint32_t vout, const std::string& output_descriptor,
    const Amount& amount, const std::string& asset, const void* binary_data,
    Utxo* utxo, const Script* scriptsig_template) {
  if (utxo == nullptr) {
    warn(CFD_LOG_SOURCE, "utxo is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to convert utxo. utxo is nullptr.");
  }
  memset(utxo, 0, sizeof(*utxo));

  UtxoData utxo_data;
  utxo_data.txid = txid;
  utxo_data.vout = vout;
  utxo_data.descriptor = output_descriptor;
  utxo_data.amount = amount;
  utxo_data.address_type = AddressType::kP2wpkhAddress;  // initialize
  if (scriptsig_template != nullptr) {
    utxo_data.scriptsig_template = *scriptsig_template;
  }
  memcpy(&utxo_data.binary_data, &binary_data, sizeof(void*));
#ifndef CFD_DISABLE_ELEMENTS
  if (!asset.empty()) {
    utxo_data.asset = ConfidentialAssetId(asset);
  }
#endif  // CFD_DISABLE_ELEMENTS
  UtxoUtil::ConvertToUtxo(utxo_data, utxo, nullptr);
}